

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::skip<Imf_3_4::CharPtrIO,char_const*>(char **in,int n)

{
  bool bVar1;
  char c [1024];
  char acStack_418 [1024];
  
  while( true ) {
    if (n < 0x400) {
      if (0 < n) {
        CharPtrIO::readChars(in,acStack_418,n);
      }
      return;
    }
    bVar1 = CharPtrIO::readChars(in,acStack_418,0x400);
    if (!bVar1) break;
    n = n + -0x400;
  }
  return;
}

Assistant:

void
skip (T& in, int n) // skip n padding bytes
{
    char c[1024];

    while (n >= (int) sizeof (c))
    {
        if (!S::readChars (in, c, sizeof (c))) return;

        n -= sizeof (c);
    }

    if (n >= 1) S::readChars (in, c, n);
}